

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

unsigned_long_long
ImGui::RoundScalarWithFormatT<unsigned_long_long,long_long>
          (char *format,ImGuiDataType data_type,unsigned_long_long v)

{
  char *fmt;
  double dVar1;
  char **local_80;
  char *p;
  char v_str [64];
  char *fmt_start;
  unsigned_long_long v_local;
  char *pcStack_18;
  ImGuiDataType data_type_local;
  char *format_local;
  
  fmt_start = (char *)v;
  v_local._4_4_ = data_type;
  pcStack_18 = format;
  fmt = ImParseFormatFindStart(format);
  if ((*fmt == '%') && (fmt[1] != '%')) {
    ImFormatString((char *)&p,0x40,fmt,fmt_start);
    for (local_80 = &p; *(char *)local_80 == ' '; local_80 = (char **)((long)local_80 + 1)) {
    }
    if ((v_local._4_4_ == 8) || (v_local._4_4_ == 9)) {
      dVar1 = atof((char *)local_80);
      fmt_start = (char *)((long)dVar1 | (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f
                          );
    }
    else {
      ImAtoi<long_long>((char *)local_80,(longlong *)&fmt_start);
    }
    format_local = fmt_start;
  }
  else {
    format_local = fmt_start;
  }
  return (unsigned_long_long)format_local;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}